

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::mid(QString *this,qsizetype position,qsizetype n)

{
  CutResult CVar1;
  qsizetype originalLength;
  QString *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  DataPointer *in_stack_ffffffffffffff88;
  QArrayDataPointer<char16_t> *rawData;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rawData = in_RDI;
  originalLength = size(in_RSI);
  CVar1 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_10,&local_18);
  switch(CVar1) {
  case Null:
    QString((QString *)0x15aae8);
    break;
  case Empty:
    QArrayDataPointer<char16_t>::fromRawData((char16_t *)rawData,(qsizetype)in_RDI);
    QString((QString *)in_RDI,in_stack_ffffffffffffff88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    break;
  case Full:
    QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff88);
    break;
  case Subset:
    sliced(in_RSI,(qsizetype)rawData,(qsizetype)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)rawData;
}

Assistant:

QString QString::mid(qsizetype position, qsizetype n) const &
{
    qsizetype p = position;
    qsizetype l = n;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QString();
    case QContainerImplHelper::Empty:
        return QString(DataPointer::fromRawData(&_empty, 0));
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        return sliced(p, l);
    }
    Q_UNREACHABLE_RETURN(QString());
}